

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O1

streamsize __thiscall
stream::inno_exe_decoder_4108::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_4108 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  ulong unaff_RBP;
  ulong uVar6;
  
  if (0 < n) {
    uVar6 = 0;
    do {
      pbVar1 = *(byte **)&src->field_0x10;
      if (pbVar1 < *(byte **)&src->field_0x18) {
        uVar3 = (uint)*pbVar1;
        *(byte **)&src->field_0x10 = pbVar1 + 1;
      }
      else {
        uVar3 = (**(code **)(*(long *)src + 0x50))(src);
      }
      uVar5 = src->flags_ | 0xfffffffe;
      if (uVar3 != 0xffffffff) {
        uVar5 = uVar3;
      }
      if (uVar5 == 0xffffffff) {
        bVar2 = false;
        unaff_RBP = -(ulong)(uVar6 == 0) | uVar6;
      }
      else if (uVar5 == 0xfffffffe) {
        bVar2 = false;
        unaff_RBP = uVar6;
      }
      else {
        if (this->addr_bytes_left == 0) {
          if ((uVar5 & 0xfffffffe) == 0xe8) {
            this->addr = -this->addr_offset;
            sVar4 = 4;
            goto LAB_0014d58f;
          }
        }
        else {
          uVar5 = (uVar5 & 0xff) + this->addr;
          this->addr = uVar5 >> 8;
          sVar4 = this->addr_bytes_left - 1;
LAB_0014d58f:
          this->addr_bytes_left = sVar4;
        }
        *dest = (char)uVar5;
        dest = dest + 1;
        bVar2 = true;
      }
      if (!bVar2) {
        return unaff_RBP;
      }
      uVar6 = uVar6 + 1;
      this->addr_offset = this->addr_offset + 1;
    } while (n != uVar6);
  }
  return n;
}

Assistant:

std::streamsize inno_exe_decoder_4108::read(Source & src, char * dest, std::streamsize n) {
	
	for(std::streamsize i = 0; i < n; i++, addr_offset++) {
		
		int byte = boost::iostreams::get(src);
		if(byte == EOF) { return i ? i : EOF; }
		if(byte == boost::iostreams::WOULD_BLOCK) { return i; }
		
		if(addr_bytes_left == 0) {
			
			// Check if this is a CALL or JMP instruction.
			if(byte == 0xe8 || byte == 0xe9) {
				addr = ~addr_offset + 1;
				addr_bytes_left = 4;
			}
			
		} else {
			addr += boost::uint8_t(byte);
			byte = boost::uint8_t(addr);
			addr >>= 8;
			addr_bytes_left--;
		}
		
		*dest++ = char(boost::uint8_t(byte));
	}
	
	return n;
}